

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::DimensionStyleWithFontCharacteristics
          (ONX_Model *this,ON_Font *font_characteristics,double model_space_text_scale)

{
  ON_ModelComponent *pOVar1;
  uchar auVar2 [8];
  ON_DimStyle *pOVar3;
  ON_ComponentManifest *manifest;
  ON_Font *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ON_UUID OVar4;
  ON_ModelComponentReference OVar5;
  bool bResolveIdAndNameConflicts;
  ON_DimStyle *new_dim_style;
  undefined1 local_70 [24];
  ON_DimStyle *default_dim_style;
  ON_wString local_48;
  ON_DimStyle *dim_style;
  ON_ModelComponentReference existing_mcr;
  bool bIgnoreSystemComponents;
  double model_space_text_scale_local;
  ON_Font *font_characteristics_local;
  ONX_Model *this_local;
  
  existing_mcr.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  FirstDimensionStyleFromFont
            ((ONX_Model *)&dim_style,font_characteristics,model_space_text_scale,SUB81(in_RDX,0));
  pOVar1 = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)&dim_style);
  local_48.m_s = (wchar_t *)ON_DimStyle::Cast(&pOVar1->super_ON_Object);
  if ((ON_DimStyle *)local_48.m_s == (ON_DimStyle *)0x0) {
    OVar4 = ON_3dmSettings::CurrentDimensionStyleId
                      ((ON_3dmSettings *)&font_characteristics[3].m_point_size);
    auVar2 = OVar4._0_8_;
    OVar4.Data4[0] = auVar2[0];
    OVar4.Data4[1] = auVar2[1];
    OVar4.Data4[2] = auVar2[2];
    OVar4.Data4[3] = auVar2[3];
    OVar4.Data4[4] = auVar2[4];
    OVar4.Data4[5] = auVar2[5];
    OVar4.Data4[6] = auVar2[6];
    OVar4.Data4[7] = auVar2[7];
    OVar4._0_8_ = font_characteristics;
    DimensionStyleFromId((ONX_Model *)local_70,OVar4);
    pOVar1 = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)local_70);
    pOVar3 = ON_DimStyle::Cast(&pOVar1->super_ON_Object);
    ON_ModelComponentReference::~ON_ModelComponentReference((ON_ModelComponentReference *)local_70);
    local_70._16_8_ = pOVar3;
    manifest = Manifest((ONX_Model *)font_characteristics);
    pOVar3 = ON_DimStyle::CreateFromFont
                       (in_RDX,model_space_text_scale,pOVar3,manifest,(ON_DimStyle *)0x0);
    if (pOVar3 == (ON_DimStyle *)0x0) {
      ON_ModelComponentReference::ON_ModelComponentReference
                ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    }
    else {
      AddManagedModelComponent(this,(ON_ModelComponent *)font_characteristics,SUB81(pOVar3,0));
    }
  }
  else {
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,(ON_ModelComponentReference *)&dim_style);
  }
  default_dim_style._0_4_ = 1;
  ON_ModelComponentReference::~ON_ModelComponentReference((ON_ModelComponentReference *)&dim_style);
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::DimensionStyleWithFontCharacteristics(
  const ON_Font& font_characteristics,
  double model_space_text_scale
)
{
  // search for existing dimension style
  const bool bIgnoreSystemComponents = true;
  ON_ModelComponentReference existing_mcr = this->FirstDimensionStyleFromFont(&font_characteristics, model_space_text_scale, bIgnoreSystemComponents);
  const ON_DimStyle* dim_style = ON_DimStyle::Cast(existing_mcr.ModelComponent());
  if (nullptr != dim_style)
    return existing_mcr;
  
  // create new dimension style
  const ON_DimStyle* default_dim_style = ON_DimStyle::Cast(this->DimensionStyleFromId(this->m_settings.CurrentDimensionStyleId()).ModelComponent());
  ON_DimStyle* new_dim_style = ON_DimStyle::CreateFromFont(&font_characteristics, model_space_text_scale, default_dim_style, &this->Manifest(), nullptr);
  if (nullptr != new_dim_style)
  {
    const bool bResolveIdAndNameConflicts = true;
    return this->AddManagedModelComponent(new_dim_style, bResolveIdAndNameConflicts);
  }

  return ON_ModelComponentReference::Empty;
}